

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_losertree.cpp
# Opt level: O3

void mergesort_losertree_parallel<64u>(uchar **strings,size_t n,uchar **tmp)

{
  ulong uVar1;
  uchar *puVar2;
  long lVar3;
  uchar **ppuVar4;
  undefined1 auVar5 [16];
  double dVar6;
  loser_tree<unsigned_char_*> tree;
  loser_tree<unsigned_char_*> local_440;
  pair<unsigned_char_**,_unsigned_long> local_428 [63];
  uchar **local_38;
  long local_30;
  
  if (n < 0x10000) {
    mergesort_4way_parallel(strings,n,tmp);
    return;
  }
  auVar5._8_4_ = (int)(n >> 0x20);
  auVar5._0_8_ = n;
  auVar5._12_4_ = 0x45300000;
  dVar6 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0)) * 0.015625;
  uVar1 = (ulong)dVar6;
  uVar1 = (long)(dVar6 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f | uVar1;
  memset(local_428,0,0x3f0);
  lVar3 = 8;
  ppuVar4 = strings;
  do {
    *(uchar ***)((long)local_428 + lVar3 + -8) = ppuVar4;
    *(ulong *)((long)&local_428[0].first + lVar3) = uVar1;
    ppuVar4 = ppuVar4 + uVar1;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x3f8);
  local_38 = strings + uVar1 * 0x3f;
  local_30 = uVar1 * -0x3f + n;
  lVar3 = 0;
  do {
    ppuVar4 = *(uchar ***)((long)&local_428[0].first + lVar3);
    mergesort_losertree_parallel<64u>
              (ppuVar4,*(size_t *)((long)&local_428[0].second + lVar3),
               (uchar **)(((long)ppuVar4 - (long)strings) + (long)tmp));
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x400);
  loser_tree<unsigned_char*>::loser_tree<std::pair<unsigned_char**,unsigned_long>*>
            ((loser_tree<unsigned_char*> *)&local_440,local_428,
             (pair<unsigned_char_**,_unsigned_long> *)&stack0xffffffffffffffd8);
  if (local_440._nonempty_streams != 0) {
    ppuVar4 = tmp;
    do {
      puVar2 = loser_tree<unsigned_char_*>::min(&local_440);
      *ppuVar4 = puVar2;
      ppuVar4 = ppuVar4 + 1;
    } while (local_440._nonempty_streams != 0);
  }
  memcpy(strings,tmp,n << 3);
  loser_tree<unsigned_char_*>::~loser_tree(&local_440);
  return;
}

Assistant:

static void
mergesort_losertree_parallel(unsigned char** strings, size_t n, unsigned char** tmp)
{
	if (n < 0x10000) {
		mergesort_4way_parallel(strings, n, tmp);
		return;
	}
	debug() << __func__ << "(), n="<<n<<"\n";
	const size_t split = size_t(double(n) / double(K));
	std::array<std::pair<unsigned char**, size_t>, K> ranges;
	for (unsigned i=0; i < K-1; ++i) {
		ranges[i] = std::make_pair(strings+i*split, split);
	}
	ranges[K-1] = std::make_pair(strings+(K-1)*split, n-(K-1)*split);
#pragma omp parallel for
	for (unsigned i=0; i < K; ++i) {
		mergesort_losertree_parallel<K>(ranges[i].first, ranges[i].second,
				tmp+(ranges[i].first-strings));
	}
	unsigned char** result = tmp;
	loser_tree<unsigned char*> tree(ranges.begin(), ranges.end());
	while (tree._nonempty_streams) { *result++ = tree.min(); }
	(void) memcpy(strings, tmp, n*sizeof(unsigned char*));
}